

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O3

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper>::Create
          (GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper> *this)

{
  string msg;
  string local_30;
  
  if (this->m_uiHandle != 0) {
    Diligent::FormatString<char[33]>(&local_30,(char (*) [33])"GL object is already initialized");
    Diligent::DebugAssertionFailed
              ((Char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(GLuint)local_30._M_dataplus._M_p),
               "Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x5a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(GLuint)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_30._M_dataplus._M_p._4_4_,(GLuint)local_30._M_dataplus._M_p),
                      local_30.field_2._M_allocated_capacity + 1);
    }
    if (this->m_uiHandle != 0) {
      local_30._M_dataplus._M_p._0_4_ = this->m_uiHandle;
      (*__glewDeleteQueries)(1,(GLuint *)&local_30);
      this->m_uiHandle = 0;
    }
  }
  (*__glewGenQueries)(1,&this->m_uiHandle);
  if (this->m_uiHandle == 0) {
    Diligent::FormatString<char[31]>(&local_30,(char (*) [31])"Failed to initialize GL object");
    Diligent::DebugAssertionFailed
              ((Char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(GLuint)local_30._M_dataplus._M_p),
               "Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x5d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(GLuint)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_30._M_dataplus._M_p._4_4_,(GLuint)local_30._M_dataplus._M_p),
                      local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Create()
    {
        VERIFY(m_uiHandle == 0, "GL object is already initialized");
        Release();
        m_CreateReleaseHelper.Create(m_uiHandle);
        VERIFY(m_uiHandle, "Failed to initialize GL object");
    }